

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int mbedtls_ecjpake_write_round_two
              (mbedtls_ecjpake_context *ctx,uchar *buf,size_t len,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_ecp_group *grp;
  uchar *puVar1;
  int iVar2;
  uchar *end;
  undefined1 local_d0 [8];
  mbedtls_ecp_point G;
  mbedtls_ecp_point Xm;
  undefined1 local_68 [8];
  mbedtls_mpi xm;
  size_t ec_len;
  uchar *local_38;
  uchar *p;
  
  local_38 = buf;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_d0);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&G.Z.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_68);
  grp = &ctx->grp;
  iVar2 = ecjpake_ecp_add3(grp,(mbedtls_ecp_point *)local_d0,&ctx->Xp1,&ctx->Xp2,&ctx->Xm1);
  if (((iVar2 != 0) ||
      (iVar2 = ecjpake_mul_secret((mbedtls_mpi *)local_68,1,&ctx->xm2,&ctx->s,&(ctx->grp).N,f_rng,
                                  p_rng), iVar2 != 0)) ||
     (iVar2 = mbedtls_ecp_mul(grp,(mbedtls_ecp_point *)&G.Z.s,(mbedtls_mpi *)local_68,
                              (mbedtls_ecp_point *)local_d0,f_rng,p_rng), iVar2 != 0))
  goto LAB_0021e7ed;
  if (ctx->role == MBEDTLS_ECJPAKE_SERVER) {
    if ((long)len < 0) {
      iVar2 = -0x4f00;
      goto LAB_0021e7ed;
    }
    iVar2 = mbedtls_ecp_tls_write_group(grp,(size_t *)&xm.s,buf,len);
    if (iVar2 != 0) goto LAB_0021e7ed;
    local_38 = buf + xm._8_8_;
  }
  puVar1 = local_38;
  end = buf + len;
  iVar2 = -0x4f00;
  if ((local_38 <= end) &&
     (iVar2 = mbedtls_ecp_tls_write_point
                        (grp,(mbedtls_ecp_point *)&G.Z.s,ctx->point_format,(size_t *)&xm.s,local_38,
                         (long)end - (long)local_38), iVar2 == 0)) {
    local_38 = puVar1 + xm._8_8_;
    iVar2 = ecjpake_zkp_write(ctx->md_type,grp,ctx->point_format,(mbedtls_ecp_point *)local_d0,
                              (mbedtls_mpi *)local_68,(mbedtls_ecp_point *)&G.Z.s,
                              ecjpake_id[ctx->role],&local_38,end,f_rng,p_rng);
    if (iVar2 == 0) {
      *olen = (long)local_38 - (long)buf;
      iVar2 = 0;
    }
  }
LAB_0021e7ed:
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_d0);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)&G.Z.s);
  mbedtls_mpi_free((mbedtls_mpi *)local_68);
  return iVar2;
}

Assistant:

int mbedtls_ecjpake_write_round_two(mbedtls_ecjpake_context *ctx,
                                    unsigned char *buf, size_t len, size_t *olen,
                                    int (*f_rng)(void *, unsigned char *, size_t),
                                    void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point G;    /* C: GA, S: GB */
    mbedtls_ecp_point Xm;   /* C: Xc, S: Xs */
    mbedtls_mpi xm;         /* C: xc, S: xs */
    unsigned char *p = buf;
    const unsigned char *end = buf + len;
    size_t ec_len;

    mbedtls_ecp_point_init(&G);
    mbedtls_ecp_point_init(&Xm);
    mbedtls_mpi_init(&xm);

    /*
     * First generate private/public key pair (S: 7.4.2.5.1, C: 7.4.2.6.1)
     *
     * Client:  GA = X1  + X3  + X4  | xs = x2  * s | Xc = xc * GA
     * Server:  GB = X3  + X1  + X2  | xs = x4  * s | Xs = xs * GB
     * Unified: G  = Xm1 + Xp1 + Xp2 | xm = xm2 * s | Xm = xm * G
     */
    MBEDTLS_MPI_CHK(ecjpake_ecp_add3(&ctx->grp, &G,
                                     &ctx->Xp1, &ctx->Xp2, &ctx->Xm1));
    MBEDTLS_MPI_CHK(ecjpake_mul_secret(&xm, 1, &ctx->xm2, &ctx->s,
                                       &ctx->grp.N, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_mul(&ctx->grp, &Xm, &xm, &G, f_rng, p_rng));

    /*
     * Now write things out
     *
     * struct {
     *     ECParameters curve_params;   // only server writing its message
     *     ECJPAKEKeyKP ecjpake_key_kp;
     * } Client/ServerECJPAKEParams;
     */
    if (ctx->role == MBEDTLS_ECJPAKE_SERVER) {
        if (end < p) {
            ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
            goto cleanup;
        }
        MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_group(&ctx->grp, &ec_len,
                                                    p, end - p));
        p += ec_len;
    }

    if (end < p) {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(&ctx->grp, &Xm,
                                                ctx->point_format, &ec_len, p, end - p));
    p += ec_len;

    MBEDTLS_MPI_CHK(ecjpake_zkp_write(ctx->md_type, &ctx->grp,
                                      ctx->point_format,
                                      &G, &xm, &Xm, ID_MINE,
                                      &p, end, f_rng, p_rng));

    *olen = p - buf;

cleanup:
    mbedtls_ecp_point_free(&G);
    mbedtls_ecp_point_free(&Xm);
    mbedtls_mpi_free(&xm);

    return ret;
}